

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O2

Value * __thiscall SparseArray<Value>::Get(SparseArray<Value> *this,uint32 index)

{
  SAChunk<Value> *pSVar1;
  
  pSVar1 = (SAChunk<Value> *)&this->firstChunk;
  while( true ) {
    pSVar1 = pSVar1->next;
    if (pSVar1 == (SAChunk<Value> *)0x0) {
      return (Value *)0x0;
    }
    if (index < pSVar1->startIndex) break;
    if (index < pSVar1->startIndex + this->chunkSize) {
      return (Value *)(&pSVar1[1].next)[(ulong)index % (ulong)this->chunkSize];
    }
  }
  return (Value *)0x0;
}

Assistant:

T * Get(uint32 index)
    {
        SAChunk<T> * chunk;
        uint32 indexInChunk = (index % this->chunkSize);

        for (chunk = this->firstChunk; chunk; chunk = chunk->next)
        {
            if (index < chunk->startIndex)
            {
                return NULL;
            }
            if (index < chunk->startIndex + this->chunkSize)
            {
                return chunk->data[indexInChunk];
            }
        }

        return NULL;
    }